

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void predict_and_reconstruct_intra_block
               (AV1_COMMON *cm,DecoderCodingBlock *dcb,aom_reader *r,int plane,int row,int col,
               TX_SIZE tx_size)

{
  PLANE_TYPE plane_type_00;
  CFL_ALLOWED_TYPE CVar1;
  short *psVar2;
  int in_ECX;
  uint8_t *in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  uint8_t *dst;
  macroblockd_plane *pd;
  TX_TYPE tx_type;
  _Bool reduced_tx_set_used;
  eob_info *eob_data;
  PLANE_TYPE plane_type;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  MACROBLOCKD *in_stack_00000068;
  undefined7 in_stack_00000071;
  MACROBLOCKD *in_stack_ffffffffffffffa0;
  AV1_COMMON *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffc0;
  MACROBLOCKD *xd_00;
  undefined2 uVar3;
  int in_stack_ffffffffffffffd8;
  uint8_t *puVar4;
  
  xd_00 = (MACROBLOCKD *)**(undefined8 **)(in_RSI + 0x1eb8);
  puVar4 = in_RSI;
  plane_type_00 = get_plane_type(in_ECX);
  av1_predict_intra_block_facade
            ((AV1_COMMON *)CONCAT71(in_stack_00000071,tx_size),in_stack_00000068,cm._4_4_,(int)cm,
             dcb._4_4_,dcb._3_1_);
  if (((char)xd_00->plane[0].seg_dequant_QTX[0][0] == '\0') &&
     (psVar2 = (short *)(*(long *)(puVar4 + (long)in_ECX * 8 + 0x3b08) +
                        (long)(int)(uint)*(ushort *)(puVar4 + (long)in_ECX * 2 + 0x3b20) * 4),
     *psVar2 != 0)) {
    av1_get_tx_type(xd_00,plane_type_00,in_stack_ffffffffffffffc0,(int)((ulong)psVar2 >> 0x20),
                    (TX_SIZE)((ulong)psVar2 >> 0x18),
                    CONCAT13(*(undefined1 *)(in_RDI + 0x1f5),(int3)in_stack_ffffffffffffffb4) &
                    0x1ffffff);
    in_stack_ffffffffffffffa8 = (AV1_COMMON *)(in_RSI + (long)in_ECX * 0xa30 + 0x10);
    in_stack_ffffffffffffffa0 =
         (MACROBLOCKD *)
         (*(long *)&(in_stack_ffffffffffffffa8->current_frame).frame_number +
         (long)((in_R8D * (in_stack_ffffffffffffffa8->current_frame).frame_refs_short_signaling +
                in_R9D) * 4));
    inverse_transform_block
              ((DecoderCodingBlock *)CONCAT44(in_ECX,in_R8D),in_R9D,
               (TX_TYPE)((uint)in_stack_ffffffffffffffd8 >> 0x18),
               (TX_SIZE)((uint)in_stack_ffffffffffffffd8 >> 0x10),in_RSI,(int)((ulong)xd_00 >> 0x20)
               ,(int)puVar4);
  }
  uVar3 = (undefined2)((ulong)in_RSI >> 0x30);
  if ((in_ECX == 0) &&
     (CVar1 = store_cfl_required(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0), CVar1 != '\0'
     )) {
    cfl_store_tx((MACROBLOCKD *)CONCAT44(in_ECX,in_R8D),in_R9D,in_stack_ffffffffffffffd8,
                 (TX_SIZE)((ushort)uVar3 >> 8),(BLOCK_SIZE)uVar3);
  }
  return;
}

Assistant:

static inline void predict_and_reconstruct_intra_block(
    const AV1_COMMON *const cm, DecoderCodingBlock *dcb, aom_reader *const r,
    const int plane, const int row, const int col, const TX_SIZE tx_size) {
  (void)r;
  MACROBLOCKD *const xd = &dcb->xd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  PLANE_TYPE plane_type = get_plane_type(plane);

  av1_predict_intra_block_facade(cm, xd, plane, col, row, tx_size);

  if (!mbmi->skip_txfm) {
    eob_info *eob_data = dcb->eob_data[plane] + dcb->txb_offset[plane];
    if (eob_data->eob) {
      const bool reduced_tx_set_used = cm->features.reduced_tx_set_used;
      // tx_type was read out in av1_read_coeffs_txb.
      const TX_TYPE tx_type = av1_get_tx_type(xd, plane_type, row, col, tx_size,
                                              reduced_tx_set_used);
      struct macroblockd_plane *const pd = &xd->plane[plane];
      uint8_t *dst = &pd->dst.buf[(row * pd->dst.stride + col) << MI_SIZE_LOG2];
      inverse_transform_block(dcb, plane, tx_type, tx_size, dst, pd->dst.stride,
                              reduced_tx_set_used);
    }
  }
  if (plane == AOM_PLANE_Y && store_cfl_required(cm, xd)) {
    cfl_store_tx(xd, row, col, tx_size, mbmi->bsize);
  }
}